

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcErrorList.cpp
# Opt level: O0

void __thiscall
GrcErrorList::AddItem
          (GrcErrorList *this,bool fFatal,int nID,GdlObject *pgdlObj,GrpLineAndFile *plnf,
          string *staMsg)

{
  GdlObject *in_RCX;
  byte in_SIL;
  undefined1 *in_RDI;
  long in_R8;
  GrpLineAndFile *in_R9;
  GrcErrorItem *perr;
  GrpLineAndFile lnf;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  GrpLineAndFile *in_stack_ffffffffffffff20;
  GrpLineAndFile *in_stack_ffffffffffffff28;
  allocator *pgdlObj_00;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 uVar1;
  GrpLineAndFile *in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  GrcErrorItem *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [80];
  long local_20;
  GdlObject *local_18;
  byte local_9;
  
  local_9 = in_SIL & 1;
  pgdlObj_00 = &local_71;
  local_20 = in_R8;
  local_18 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_70,"",pgdlObj_00);
  GrpLineAndFile::GrpLineAndFile
            (in_R9,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20),(int)in_stack_ffffffffffffff28,
             (string *)in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  if (local_20 == 0) {
    if (local_18 != (GdlObject *)0x0) {
      in_stack_ffffffffffffff28 = GdlObject::LineAndFile(local_18);
      GrpLineAndFile::operator=
                (in_stack_ffffffffffffff20,
                 (GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    }
  }
  else {
    GrpLineAndFile::operator=
              (in_stack_ffffffffffffff20,
               (GrpLineAndFile *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  }
  operator_new(0x60);
  uVar1 = 1;
  std::__cxx11::string::string((string *)&stack0xffffffffffffff50,(string *)in_R9);
  GrcErrorItem::GrcErrorItem
            (in_stack_ffffffffffffff60,(bool)in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58,
             in_stack_ffffffffffffff50,(string *)CONCAT17(uVar1,in_stack_ffffffffffffff48),
             (GdlObject *)pgdlObj_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff50);
  std::vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_>::push_back
            ((vector<GrcErrorItem_*,_std::allocator<GrcErrorItem_*>_> *)in_R9,
             (value_type *)in_stack_ffffffffffffff28);
  if ((local_9 & 1) != 0) {
    *in_RDI = 1;
  }
  GrpLineAndFile::~GrpLineAndFile((GrpLineAndFile *)0x1ab385);
  return;
}

Assistant:

void GrcErrorList::AddItem(bool fFatal, int nID, GdlObject * pgdlObj, const GrpLineAndFile * plnf,
	std::string staMsg)
{
	GrpLineAndFile lnf(0, 0, "");
	if (plnf == NULL)
	{
		if (pgdlObj)
			lnf = pgdlObj->LineAndFile();
	}
	else
		lnf = *plnf;
	
	GrcErrorItem * perr = new GrcErrorItem(fFatal, nID, lnf, staMsg, pgdlObj);
	m_vperr.push_back(perr);

	if (fFatal)
		m_fFatalError = true;
}